

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

json_token * parse_json2(char *s,int s_len)

{
  int iVar1;
  frozen local_30;
  
  local_30.tokens = (json_token *)0x0;
  local_30.max_tokens = 0;
  local_30.num_tokens = 0;
  local_30.end = s + s_len;
  local_30.do_realloc = 1;
  local_30._36_4_ = 0;
  local_30.cur = s;
  iVar1 = doit(&local_30);
  if (iVar1 < 0) {
    free(local_30.tokens);
    local_30.tokens = (json_token *)0x0;
  }
  return local_30.tokens;
}

Assistant:

struct json_token *parse_json2(const char *s, int s_len) {
    struct frozen frozen;

    memset(&frozen, 0, sizeof(frozen));
    frozen.end = s + s_len;
    frozen.cur = s;
    frozen.do_realloc = 1;

    if (doit(&frozen) < 0) {
        FROZEN_FREE((void *) frozen.tokens);
        frozen.tokens = NULL;
    }
    return frozen.tokens;
}